

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O0

void __thiscall gimage::PNGImageIO::load(PNGImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  undefined1 auVar1 [16];
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  string *message;
  __jmp_buf_tag *__env;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  int d;
  long i;
  int j;
  long k_1;
  int k;
  int rn;
  int bits;
  int color;
  int depth;
  long height;
  long width;
  uchar **row;
  uchar *img;
  png_infop end;
  png_infop info;
  PNGReadData dp;
  png_structp png;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffe00;
  allocator *paVar7;
  string *in_stack_fffffffffffffe18;
  IOException *in_stack_fffffffffffffe20;
  long in_stack_fffffffffffffe28;
  long in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffe40;
  int local_1a4;
  long local_1a0;
  int local_194;
  long local_190;
  int local_184;
  allocator local_179;
  string local_178 [36];
  uint local_154;
  uint local_150;
  int local_14c;
  ulong local_148;
  ulong local_140;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  void *local_110;
  void *local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  long local_d8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  long local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  undefined8 local_20;
  undefined8 local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar5 = (**(code **)(*in_RDI + 0x68))(in_RDI,in_RDX,in_RCX);
  if ((uVar5 & 1) == 0) {
    local_55 = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Can only load PNG image format",&local_41);
    gutil::IOException::IOException(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_55 = 0;
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_60 = png_create_read_struct("1.6.37",0,0);
  if (local_60 == 0) {
    local_82 = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    paVar7 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Cannot allocate handle for reading PNG files",paVar7);
    gutil::IOException::IOException(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_82 = 0;
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_a0 = local_18;
  local_98 = local_20;
  local_90 = 0;
  png_set_read_fn(local_60,&local_a0,anon_unknown_2::readPNGData);
  local_a8 = png_create_info_struct(local_60);
  if (local_a8 == 0) {
    png_destroy_read_struct(&local_60,0);
    local_ca = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    paVar7 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Cannot allocate PNG info structure",paVar7);
    gutil::IOException::IOException(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_ca = 0;
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_d8 = png_create_info_struct(local_60);
  if (local_d8 == 0) {
    png_destroy_read_struct(&local_60,&local_a8,0);
    local_fa = 1;
    message = (string *)__cxa_allocate_exception(0x28);
    paVar7 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Cannot allocate PNG info structure",paVar7);
    gutil::IOException::IOException((IOException *)paVar7,message);
    local_fa = 0;
    __cxa_throw(message,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_108 = (void *)0x0;
  local_110 = (void *)0x0;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_60,longjmp,200);
  iVar3 = _setjmp(__env);
  if (iVar3 != 0) {
    if (local_108 != (void *)0x0) {
      operator_delete__(local_108);
    }
    if (local_110 != (void *)0x0) {
      operator_delete__(local_110);
    }
    png_destroy_read_struct(&local_60,&local_a8,&local_d8);
    local_132 = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    paVar7 = &local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Cannot read PNG image from memory",paVar7);
    gutil::IOException::IOException(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_132 = 0;
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  png_read_info(local_60,local_a8);
  uVar4 = png_get_image_width(local_60,local_a8);
  local_140 = (ulong)uVar4;
  uVar4 = png_get_image_height(local_60,local_a8);
  local_148 = (ulong)uVar4;
  local_14c = 1;
  bVar2 = png_get_color_type(local_60,local_a8);
  local_150 = (uint)bVar2;
  if ((local_150 == 3) || (local_150 == 2)) {
    local_14c = 3;
  }
  if (local_150 == 6) {
    local_14c = 4;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffffe00);
  if (local_150 == 3) {
    png_set_palette_to_rgb(local_60);
  }
  bVar2 = png_get_bit_depth(local_60,local_a8);
  local_154 = (uint)bVar2;
  if (8 < local_154) {
    png_destroy_read_struct(&local_60,&local_a8,&local_d8);
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"PNG image with <= 8 bits expected",&local_179);
    gutil::IOException::IOException(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  if ((local_150 == 0) && (local_154 < 8)) {
    png_set_expand_gray_1_2_4_to_8(local_60);
  }
  iVar3 = png_get_rowbytes(local_60,local_a8);
  uVar5 = local_148 * (long)iVar3;
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_108 = operator_new__(uVar5);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_148;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_110 = operator_new__(uVar5);
  for (local_184 = 0; (long)local_184 < (long)local_148; local_184 = local_184 + 1) {
    *(long *)((long)local_110 + (long)local_184 * 8) = (long)local_108 + (long)(local_184 * iVar3);
  }
  png_read_image(local_60,local_110);
  for (local_190 = 0; local_190 < (long)local_148; local_190 = local_190 + 1) {
    local_194 = 0;
    for (local_1a0 = 0; local_1a0 < (long)local_140; local_1a0 = local_1a0 + 1) {
      for (local_1a4 = 0; local_1a4 < local_14c; local_1a4 = local_1a4 + 1) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_10,local_1a0,local_190,local_1a4,
                   *(store_t *)(*(long *)((long)local_110 + local_190 * 8) + (long)local_194));
        local_194 = local_194 + 1;
      }
    }
  }
  if (local_110 != (void *)0x0) {
    operator_delete__(local_110);
  }
  if (local_108 != (void *)0x0) {
    operator_delete__(local_108);
  }
  png_destroy_read_struct(&local_60,&local_a8,&local_d8);
  return;
}

Assistant:

void PNGImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length) const
{
  if (!handles(data, length))
  {
    throw gutil::IOException("Can only load PNG image format");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  PNGReadData dp;
  dp.data=data;
  dp.length=length;
  dp.i=0;

  png_set_read_fn(png, &dp, readPNGData);

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("Cannot read PNG image from memory");
  }

  // read header data

  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB)
  {
    depth=3;
  }

  if (color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=4;
  }

  image.setSize(width, height, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("PNG image with <= 8 bits expected");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  for (long k=0; k<height; k++)
  {
    int j=0;

    for (long i=0; i<width; i++)
    {
      for (int d=0; d<depth; d++)
      {
        image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
}